

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_13,_2,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  MatrixCaseUtils local_bc [12];
  VecAccess<float,_4,_3> local_b0;
  Mat4 local_98;
  Matrix<float,_4,_4> local_58;
  
  getInputValue<2,13>(&local_98,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  tcu::operator*(&local_58,&local_98,(evalCtx->coords).m_data[0]);
  reduceToVec3(local_bc,&local_58);
  local_b0.m_vector = &evalCtx->color;
  local_b0.m_index[0] = 0;
  local_b0.m_index[1] = 1;
  local_b0.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_b0,(Vector<float,_3> *)local_bc);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}